

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1325::run(TestCase1325 *this)

{
  Fault f;
  int local_12c;
  unsigned_long local_128;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestOldUnionVersion>
            (&root,&builder.super_MessageBuilder);
  *(undefined2 *)root._builder.data = 1;
  *(undefined8 *)((long)root._builder.data + 8) = 0x7b;
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestNewUnionVersion>
            ((Builder *)&root,&builder.super_MessageBuilder);
  if (*root._builder.data == 1) {
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x538,FAILED,"root.isB()","");
  if ((*(unsigned_long *)((long)root._builder.data + 8) != 0x7b) && (kj::_::Debug::minSeverity < 3))
  {
    local_12c = 0x7b;
    local_128 = *(unsigned_long *)((long)root._builder.data + 8);
    kj::_::Debug::log<char_const(&)[40],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x539,ERROR,"\"failed: expected \" \"(123) == (root.getB())\", 123, root.getB()",
               (char (*) [40])"failed: expected (123) == (root.getB())",&local_12c,&local_128);
  }
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Encoding, UpgradeUnion) {
  // This tests for a specific case that was broken originally.
  MallocMessageBuilder builder;

  {
    auto root = builder.getRoot<test::TestOldUnionVersion>();
    root.setB(123);
  }

  {
    auto root = builder.getRoot<test::TestNewUnionVersion>();
    ASSERT_TRUE(root.isB())
    EXPECT_EQ(123, root.getB());
  }
}